

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

void deqp::gls::anon_unknown_1::logProgram(TestLog *log,Functions *gl,deUint32 program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  undefined4 uVar3;
  GLenum GVar4;
  char *pcVar5;
  ScopedLogSection infoLogSection;
  ScopedLogSection linkInfo;
  string programInfoLog;
  deInt32 length;
  string local_200;
  ScopedLogSection local_1e0;
  ScopedLogSection local_1d8;
  GLchar *local_1d0;
  long local_1c8;
  GLchar local_1c0;
  undefined7 uStack_1bf;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  (*gl->getProgramiv)(program,0x8b82,(GLint *)local_1b0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x162);
  uVar3 = local_1b0._0_4_;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  local_1c8 = 0;
  local_1c0 = '\0';
  local_1d0 = &local_1c0;
  (*gl->getProgramiv)(program,0x8b84,(GLint *)local_1b0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x153);
  std::__cxx11::string::resize((ulong)&local_1d0,(char)local_1b0._0_8_);
  (*gl->getProgramInfoLog)(program,(GLsizei)local_1c8,(GLsizei *)0x0,local_1d0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramInfoLog()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x158);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Program Link Info","");
  paVar1 = &local_200.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Program Link Info","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,(string *)local_1b0,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Info Log","");
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Info Log","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1e0,log,(string *)local_1b0,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,local_1d0,local_1c8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection(local_1e0.m_log);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Link result: ",0xd);
  pcVar5 = "Fail";
  if (uVar3 == 1) {
    pcVar5 = "Ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,pcVar5,(ulong)(uVar3 != 1) * 2 + 2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection(local_1d8.m_log);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  return;
}

Assistant:

void logProgram (TestLog& log, const glw::Functions& gl, deUint32 program)
{
	const bool				programLinkOk	= getProgramLinkStatus(gl, program);
	const string			programInfoLog	= getProgramInfoLog(gl, program);
	tcu::ScopedLogSection	linkInfo		(log, "Program Link Info", "Program Link Info");

	{
		tcu::ScopedLogSection infoLogSection(log, "Info Log", "Info Log");

		log << TestLog::Message << programInfoLog << TestLog::EndMessage;
	}

	log << TestLog::Message << "Link result: " << (programLinkOk ? "Ok" : "Fail") << TestLog::EndMessage;
}